

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void ossl_close(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 *puVar1;
  
  puVar1 = *(undefined8 **)((long)cf->ctx + 0x30);
  if ((SSL *)puVar1[1] != (SSL *)0x0) {
    SSL_free((SSL *)puVar1[1]);
    puVar1[1] = 0;
  }
  if ((SSL_CTX *)*puVar1 != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)*puVar1);
    *puVar1 = 0;
    *(byte *)((long)puVar1 + 0x25) = *(byte *)((long)puVar1 + 0x25) & 0xfe;
  }
  if (puVar1[3] != 0) {
    BIO_meth_free();
    puVar1[3] = 0;
  }
  return;
}

Assistant:

static void ossl_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  (void)data;
  DEBUGASSERT(octx);

  if(octx->ssl) {
    SSL_free(octx->ssl);
    octx->ssl = NULL;
  }
  if(octx->ssl_ctx) {
    SSL_CTX_free(octx->ssl_ctx);
    octx->ssl_ctx = NULL;
    octx->x509_store_setup = FALSE;
  }
  if(octx->bio_method) {
    ossl_bio_cf_method_free(octx->bio_method);
    octx->bio_method = NULL;
  }
}